

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmse.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer data_to_write;
  uint uVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  char *pcVar11;
  ifstream *input_stream;
  ulong uVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator local_7b5;
  int vector_length;
  undefined8 local_7b0;
  char **local_7a8;
  string local_7a0;
  vector<double,_std::allocator<double>_> mean_squared_error;
  double magic_number;
  StatisticsAccumulation accumulation;
  vector<double,_std::allocator<double>_> data2;
  vector<double,_std::allocator<double>_> data1;
  ostringstream error_message_6;
  Buffer buffer_for_mean_squared_error;
  ifstream ifs2;
  byte abStack_4e8 [488];
  ifstream ifs1;
  byte abStack_2e0 [488];
  Buffer buffer_for_mean;
  option long_options [2];
  
  vector_length = -1;
  magic_number = 0.0;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 1000;
  long_options[0]._28_4_ = 0;
  long_options[0].name = "magic";
  long_options[0].has_arg = 1;
  long_options[0]._12_4_ = 0;
  bVar7 = false;
  bVar6 = false;
  local_7a8 = argv;
  do {
    iVar8 = ya_getopt_long_only(argc,local_7a8,"l:m:fh",long_options,(int *)0x0);
    switch(iVar8) {
    case 0x66:
      bVar7 = true;
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
switchD_00102630_caseD_67:
      anon_unknown.dwarf_32ed::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x68:
      anon_unknown.dwarf_32ed::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar13 = sptk::ConvertStringToInteger((string *)&ifs1,&vector_length);
      bVar4 = vector_length < 1;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar13 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"The argument for the -l option must be a positive integer"
                       );
        std::__cxx11::string::string((string *)&ifs2,"rmse",(allocator *)&error_message_6);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_001029b3;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&vector_length);
      bVar13 = vector_length < 0;
      std::__cxx11::string::~string((string *)&ifs1);
      if (!bVar4 || bVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        poVar10 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
        std::operator<<(poVar10,"non-negative integer");
        std::__cxx11::string::string((string *)&ifs2,"rmse",(allocator *)&error_message_6);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_001029b3;
      }
      vector_length = vector_length + 1;
      break;
    default:
      if (iVar8 == -1) {
        lVar9 = (long)argc;
        if (argc - ya_optind == 1) {
          lVar3 = lVar9 + -1;
          pcVar11 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
            std::operator<<((ostream *)&ifs1,"Just two input files, file1, and infile, are required"
                           );
            std::__cxx11::string::string((string *)&ifs2,"rmse",(allocator *)&error_message_6);
            sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
            goto LAB_001029b3;
          }
          lVar3 = lVar9 + -2;
          pcVar11 = local_7a8[lVar9 + -1];
        }
        pcVar1 = local_7a8[lVar3];
        bVar4 = sptk::SetBinaryMode();
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
          std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&ifs2,"rmse",(allocator *)&error_message_6);
          sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
          goto LAB_001029b3;
        }
        std::ifstream::ifstream(&ifs1);
        std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
        if ((abStack_2e0[*(long *)(_ifs1 + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
          poVar10 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
          std::operator<<(poVar10,pcVar1);
          std::__cxx11::string::string
                    ((string *)&error_message_6,"rmse",(allocator *)&buffer_for_mean_squared_error);
          sptk::PrintErrorMessage((string *)&error_message_6,(ostringstream *)&ifs2);
          std::__cxx11::string::~string((string *)&error_message_6);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
          iVar8 = 1;
          goto LAB_00102f4f;
        }
        input_stream = &ifs2;
        std::ifstream::ifstream(input_stream);
        if ((pcVar11 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar11),
           (abStack_4e8[*(long *)(_ifs2 + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
          poVar10 = std::operator<<((ostream *)&error_message_6,"Cannot open file ");
          std::operator<<(poVar10,pcVar11);
          std::__cxx11::string::string
                    ((string *)&buffer_for_mean_squared_error,"rmse",(allocator *)&buffer_for_mean);
          sptk::PrintErrorMessage((string *)&buffer_for_mean_squared_error,&error_message_6);
          std::__cxx11::string::~string((string *)&buffer_for_mean_squared_error);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
          iVar8 = 1;
          goto LAB_00102f42;
        }
        cVar5 = std::__basic_file<char>::is_open();
        if (cVar5 == '\0') {
          input_stream = (ifstream *)&std::cin;
        }
        iVar8 = 1;
        sptk::StatisticsAccumulation::StatisticsAccumulation(&accumulation,0,1,false,false);
        sptk::StatisticsAccumulation::Buffer::Buffer(&buffer_for_mean_squared_error);
        sptk::StatisticsAccumulation::Buffer::Buffer(&buffer_for_mean);
        if (accumulation.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
          std::operator<<((ostream *)&error_message_6,"Failed to initialize StatisticsAccumulation")
          ;
          std::__cxx11::string::string((string *)&local_7a0,"rmse",(allocator *)&data1);
          sptk::PrintErrorMessage(&local_7a0,&error_message_6);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
          goto LAB_00102f28;
        }
        iVar8 = vector_length;
        if (vector_length == -1) {
          iVar8 = 1;
        }
        local_7a8 = (char **)CONCAT44(local_7a8._4_4_,iVar8);
        std::vector<double,_std::allocator<double>_>::vector
                  (&data1,(long)iVar8,(allocator_type *)&error_message_6);
        std::vector<double,_std::allocator<double>_>::vector
                  (&data2,(long)iVar8,(allocator_type *)&error_message_6);
        local_7b0 = 0;
        uVar2 = (uint)local_7a8;
        if ((int)(uint)local_7a8 < 1) {
          uVar2 = 0;
        }
        goto LAB_00102b7a;
      }
      if (iVar8 != 1000) goto switchD_00102630_caseD_67;
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToDouble((string *)&ifs1,&magic_number);
      std::__cxx11::string::~string((string *)&ifs1);
      bVar6 = true;
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"The argument for the -magic option must be numeric");
        std::__cxx11::string::string((string *)&ifs2,"rmse",(allocator *)&error_message_6);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
LAB_001029b3:
        std::__cxx11::string::~string((string *)&ifs2);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
        return 1;
      }
    }
  } while( true );
LAB_00102b7a:
  do {
    do {
      bVar4 = sptk::ReadStream<double>(false,0,0,(uint)local_7a8,&data1,(istream *)&ifs1,(int *)0x0)
      ;
      if (!bVar4) {
LAB_00102fb6:
        if (vector_length == -1) {
          std::vector<double,_std::allocator<double>_>::vector
                    (&mean_squared_error,1,(allocator_type *)&error_message_6);
          bVar6 = sptk::StatisticsAccumulation::GetMean
                            (&accumulation,&buffer_for_mean_squared_error,&mean_squared_error);
          if (bVar6) {
            dVar16 = *mean_squared_error.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            bVar7 = sptk::WriteStream<double>(dVar16,(ostream *)&std::cout);
            bVar6 = true;
            if (!bVar7) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
              std::operator<<((ostream *)&error_message_6,"Failed to write root mean squared error")
              ;
              std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
              sptk::PrintErrorMessage(&local_7a0,&error_message_6);
              goto LAB_001031bc;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
            std::operator<<((ostream *)&error_message_6,"Failed to get mean squared error");
            std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
            sptk::PrintErrorMessage(&local_7a0,&error_message_6);
LAB_001031bc:
            std::__cxx11::string::~string((string *)&local_7a0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
            local_7b0 = 1;
            bVar6 = false;
          }
LAB_001031dd:
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&mean_squared_error.super__Vector_base<double,_std::allocator<double>_>);
          if (!bVar6) goto LAB_00102f09;
        }
        else if (!bVar7) {
          std::vector<double,_std::allocator<double>_>::vector
                    (&mean_squared_error,1,(allocator_type *)&error_message_6);
          bVar6 = sptk::StatisticsAccumulation::GetMean
                            (&accumulation,&buffer_for_mean,&mean_squared_error);
          if (bVar6) {
            bVar7 = sptk::WriteStream<double>
                              (*mean_squared_error.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,(ostream *)&std::cout);
            bVar6 = true;
            if (bVar7) goto LAB_001031dd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
            std::operator<<((ostream *)&error_message_6,"Failed to write root mean squared error");
            std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
            sptk::PrintErrorMessage(&local_7a0,&error_message_6);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
            std::operator<<((ostream *)&error_message_6,"Failed to get root mean squared error");
            std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
            sptk::PrintErrorMessage(&local_7a0,&error_message_6);
          }
          goto LAB_001031bc;
        }
        local_7b0 = 0;
        goto LAB_00102f09;
      }
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,(uint)local_7a8,&data2,(istream *)input_stream,(int *)0x0);
      if (!bVar4) goto LAB_00102fb6;
      for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
        if (bVar6) {
          dVar16 = data1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          uVar14 = SUB84(dVar16,0);
          uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
          if ((magic_number != dVar16) || (NAN(magic_number) || NAN(dVar16))) {
            dVar16 = data2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
            if ((magic_number != dVar16) || (NAN(magic_number) || NAN(dVar16))) goto LAB_00102c28;
          }
        }
        else {
          uVar14 = SUB84(data1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12],0);
          uVar15 = (undefined4)
                   ((ulong)data1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] >> 0x20);
          dVar16 = data2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
LAB_00102c28:
          dVar16 = (double)CONCAT44(uVar15,uVar14) - dVar16;
          local_7a0._M_dataplus._M_p = (pointer)(dVar16 * dVar16);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_7a0;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&error_message_6,__l,
                     (allocator_type *)&mean_squared_error);
          bVar4 = sptk::StatisticsAccumulation::Run
                            (&accumulation,
                             (vector<double,_std::allocator<double>_> *)&error_message_6,
                             &buffer_for_mean_squared_error);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&error_message_6);
          if (!bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
            std::operator<<((ostream *)&error_message_6,"Failed to accumulate statistics");
            std::__cxx11::string::string
                      ((string *)&local_7a0,"rmse",(allocator *)&mean_squared_error);
            sptk::PrintErrorMessage(&local_7a0,&error_message_6);
            std::__cxx11::string::~string((string *)&local_7a0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
            local_7b0 = 1;
            goto LAB_00102f09;
          }
        }
      }
    } while (vector_length == -1);
    std::vector<double,_std::allocator<double>_>::vector
              (&mean_squared_error,1,(allocator_type *)&error_message_6);
    bVar4 = sptk::StatisticsAccumulation::GetMean
                      (&accumulation,&buffer_for_mean_squared_error,&mean_squared_error);
    if (bVar4) {
      dVar16 = *mean_squared_error.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (dVar16 < 0.0) {
        data_to_write = (pointer)sqrt(dVar16);
      }
      else {
        data_to_write = (pointer)SQRT(dVar16);
      }
      if (bVar7) {
        bVar4 = sptk::WriteStream<double>((double)data_to_write,(ostream *)&std::cout);
        if (bVar4) {
LAB_00102db9:
          bVar4 = true;
          sptk::StatisticsAccumulation::Clear(&accumulation,&buffer_for_mean_squared_error);
          goto LAB_00102e22;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
        std::operator<<((ostream *)&error_message_6,"Failed to write root mean squared error");
        std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
        sptk::PrintErrorMessage(&local_7a0,&error_message_6);
      }
      else {
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_7a0;
        local_7a0._M_dataplus._M_p = data_to_write;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&error_message_6,__l_00,
                   (allocator_type *)&local_7b5);
        bVar4 = sptk::StatisticsAccumulation::Run
                          (&accumulation,(vector<double,_std::allocator<double>_> *)&error_message_6
                           ,&buffer_for_mean);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&error_message_6);
        if (bVar4) goto LAB_00102db9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
        std::operator<<((ostream *)&error_message_6,"Failed to accumulate statistics");
        std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
        sptk::PrintErrorMessage(&local_7a0,&error_message_6);
      }
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
      bVar4 = false;
      local_7b0 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_6);
      std::operator<<((ostream *)&error_message_6,"Failed to get mean squared error");
      std::__cxx11::string::string((string *)&local_7a0,"rmse",&local_7b5);
      sptk::PrintErrorMessage(&local_7a0,&error_message_6);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_6);
      bVar4 = false;
      local_7b0 = 1;
    }
LAB_00102e22:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&mean_squared_error.super__Vector_base<double,_std::allocator<double>_>);
  } while (bVar4);
LAB_00102f09:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data1.super__Vector_base<double,_std::allocator<double>_>);
  iVar8 = (int)local_7b0;
LAB_00102f28:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer_for_mean);
  sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer_for_mean_squared_error);
LAB_00102f42:
  std::ifstream::~ifstream(&ifs2);
LAB_00102f4f:
  std::ifstream::~ifstream(&ifs1);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kMagicNumberForEndOfFile);
  double magic_number(0.0);
  bool use_magic_number(kDefaultUseMagicNumber);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:fh", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message << "The argument for the -magic option must be numeric";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
        use_magic_number = true;
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file1(NULL);
  const char* input_file2(NULL);
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    input_file1 = argv[argc - 2];
    input_file2 = argv[argc - 1];
  } else if (1 == num_input_files) {
    input_file1 = argv[argc - 1];
    input_file2 = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1, and infile, are required";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(input_file1, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << input_file1;
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }
  std::istream& input_stream1(ifs1);

  std::ifstream ifs2;
  if (NULL != input_file2) {
    ifs2.open(input_file2, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file2;
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }
  std::istream& input_stream2(ifs2.is_open() ? ifs2 : std::cin);

  sptk::StatisticsAccumulation accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer_for_mean_squared_error;
  sptk::StatisticsAccumulation::Buffer buffer_for_mean;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("rmse", error_message);
    return 1;
  }

  const int read_size(
      kMagicNumberForEndOfFile == vector_length ? 1 : vector_length);
  std::vector<double> data1(read_size);
  std::vector<double> data2(read_size);
  while (
      sptk::ReadStream(false, 0, 0, read_size, &data1, &input_stream1, NULL) &&
      sptk::ReadStream(false, 0, 0, read_size, &data2, &input_stream2, NULL)) {
    for (int i(0); i < read_size; ++i) {
      if (!use_magic_number ||
          (magic_number != data1[i] && magic_number != data2[i])) {
        const double error(data1[i] - data2[i]);
        if (!accumulation.Run(std::vector<double>{error * error},
                              &buffer_for_mean_squared_error)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
    }

    if (kMagicNumberForEndOfFile != vector_length) {
      std::vector<double> mean_squared_error(1);
      if (!accumulation.GetMean(buffer_for_mean_squared_error,
                                &mean_squared_error)) {
        std::ostringstream error_message;
        error_message << "Failed to get mean squared error";
        sptk::PrintErrorMessage("rmse", error_message);
        return 1;
      }

      const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
      if (output_frame_by_frame) {
        if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write root mean squared error";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      } else {
        if (!accumulation.Run(std::vector<double>{root_mean_squared_error},
                              &buffer_for_mean)) {
          std::ostringstream error_message;
          error_message << "Failed to accumulate statistics";
          sptk::PrintErrorMessage("rmse", error_message);
          return 1;
        }
      }
      accumulation.Clear(&buffer_for_mean_squared_error);
    }
  }

  if (kMagicNumberForEndOfFile == vector_length) {
    std::vector<double> mean_squared_error(1);
    if (!accumulation.GetMean(buffer_for_mean_squared_error,
                              &mean_squared_error)) {
      std::ostringstream error_message;
      error_message << "Failed to get mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    const double root_mean_squared_error(std::sqrt(mean_squared_error[0]));
    if (!sptk::WriteStream(root_mean_squared_error, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  } else if (!output_frame_by_frame) {
    std::vector<double> mean(1);
    if (!accumulation.GetMean(buffer_for_mean, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to get root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }

    if (!sptk::WriteStream(mean[0], &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write root mean squared error";
      sptk::PrintErrorMessage("rmse", error_message);
      return 1;
    }
  }

  return 0;
}